

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShow.c
# Opt level: O2

int Gia_ShowCollectObjs_rec
              (Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vAdds,Vec_Int_t *vXors,Vec_Int_t *vMapAdds,
              Vec_Int_t *vMapXors,Vec_Int_t *vOrder)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  
  iVar2 = Gia_ObjId(p,pObj);
  if (p->nTravIdsAlloc <= iVar2) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  piVar1 = p->pTravIds;
  iVar2 = Gia_ObjId(p,pObj);
  if (piVar1[iVar2] == p->nTravIds) {
    iVar2 = Gia_ObjLevel(p,pObj);
    return iVar2;
  }
  Gia_ObjSetTravIdCurrent(p,pObj);
  iVar2 = 0;
  if ((~*(uint *)pObj & 0x9fffffff) != 0) {
    iVar2 = Gia_ObjId(p,pObj);
    iVar2 = Vec_IntEntry(vMapAdds,iVar2);
    iVar3 = Gia_ObjId(p,pObj);
    if (iVar2 < 0) {
      iVar2 = Vec_IntEntry(vMapXors,iVar3);
      if (iVar2 < 0) {
        iVar2 = Gia_ObjIsMux(p,pObj);
        if (iVar2 != 0) {
          __assert_fail("!Gia_ObjIsMux(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShow.c"
                        ,0x438,
                        "int Gia_ShowCollectObjs_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        iVar3 = Gia_ShowCollectObjs_rec
                          (p,pObj + -(*(ulong *)pObj & 0x1fffffff),vAdds,vXors,vMapAdds,vMapXors,
                           vOrder);
        iVar2 = Gia_ShowCollectObjs_rec
                          (p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),vAdds,vXors,
                           vMapAdds,vMapXors,vOrder);
        if (iVar2 < iVar3) {
          iVar2 = iVar3;
        }
        iVar2 = iVar2 + 1;
        Gia_ObjSetLevel(p,pObj,iVar2);
      }
      else {
        iVar2 = Gia_ObjId(p,pObj);
        iVar3 = Vec_IntEntry(vMapXors,iVar2);
        iVar2 = Vec_IntEntry(vXors,iVar3 * 4 + 1);
        pGVar7 = Gia_ManObj(p,iVar2);
        iVar4 = Gia_ShowCollectObjs_rec(p,pGVar7,vAdds,vXors,vMapAdds,vMapXors,vOrder);
        iVar2 = Vec_IntEntry(vXors,iVar3 * 4 + 2);
        pGVar7 = Gia_ManObj(p,iVar2);
        iVar2 = Gia_ShowCollectObjs_rec(p,pGVar7,vAdds,vXors,vMapAdds,vMapXors,vOrder);
        iVar5 = iVar3 * 4 + 3;
        iVar3 = Vec_IntEntry(vXors,iVar5);
        if (iVar3 == 0) {
          iVar3 = 0;
        }
        else {
          iVar3 = Vec_IntEntry(vXors,iVar5);
          pGVar7 = Gia_ManObj(p,iVar3);
          iVar3 = Gia_ShowCollectObjs_rec(p,pGVar7,vAdds,vXors,vMapAdds,vMapXors,vOrder);
        }
        if (iVar2 < iVar4) {
          iVar2 = iVar4;
        }
        if (iVar2 <= iVar3) {
          iVar2 = iVar3;
        }
        iVar2 = iVar2 + 1;
        Gia_ObjSetLevel(p,pObj,iVar2);
      }
    }
    else {
      iVar4 = Vec_IntEntry(vMapAdds,iVar3);
      iVar4 = iVar4 * 6;
      iVar2 = Vec_IntEntry(vAdds,iVar4 + 3);
      Gia_ObjSetTravIdCurrentId(p,iVar2);
      iVar3 = iVar4 + 4;
      iVar2 = Vec_IntEntry(vAdds,iVar3);
      Gia_ObjSetTravIdCurrentId(p,iVar2);
      iVar2 = Vec_IntEntry(vAdds,iVar4);
      pGVar7 = Gia_ManObj(p,iVar2);
      iVar5 = Gia_ShowCollectObjs_rec(p,pGVar7,vAdds,vXors,vMapAdds,vMapXors,vOrder);
      iVar2 = Vec_IntEntry(vAdds,iVar4 + 1);
      pGVar7 = Gia_ManObj(p,iVar2);
      iVar2 = Gia_ShowCollectObjs_rec(p,pGVar7,vAdds,vXors,vMapAdds,vMapXors,vOrder);
      iVar6 = Vec_IntEntry(vAdds,iVar4 + 2);
      if (iVar6 == 0) {
        iVar6 = 0;
      }
      else {
        iVar6 = Vec_IntEntry(vAdds,iVar4 + 2);
        pGVar7 = Gia_ManObj(p,iVar6);
        iVar6 = Gia_ShowCollectObjs_rec(p,pGVar7,vAdds,vXors,vMapAdds,vMapXors,vOrder);
      }
      if (iVar2 < iVar5) {
        iVar2 = iVar5;
      }
      if (iVar2 <= iVar6) {
        iVar2 = iVar6;
      }
      iVar2 = iVar2 + 1;
      iVar4 = Vec_IntEntry(vAdds,iVar4 + 3);
      Gia_ObjSetLevelId(p,iVar4,iVar2);
      iVar4 = Vec_IntEntry(vAdds,iVar3);
      Gia_ObjSetLevelId(p,iVar4,iVar2);
      iVar3 = Vec_IntEntry(vAdds,iVar3);
      pObj = Gia_ManObj(p,iVar3);
    }
    iVar4 = Gia_ObjId(p,pObj);
    iVar3 = vOrder->nSize;
    if (iVar3 == vOrder->nCap) {
      iVar5 = 0x10;
      if (0xf < iVar3) {
        iVar5 = iVar3 * 2;
      }
      Vec_IntGrow(vOrder,iVar5);
      iVar3 = vOrder->nSize;
    }
    vOrder->nSize = iVar3 + 1;
    vOrder->pArray[iVar3] = iVar4;
    iVar3 = p->nLevels;
    if (p->nLevels <= iVar2) {
      iVar3 = iVar2;
    }
    p->nLevels = iVar3;
  }
  return iVar2;
}

Assistant:

int Gia_ShowCollectObjs_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vAdds, Vec_Int_t * vXors, Vec_Int_t * vMapAdds, Vec_Int_t * vMapXors, Vec_Int_t * vOrder )
{
    int Level0, Level1, Level2 = 0, Level = 0;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return Gia_ObjLevel(p, pObj);
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
        return 0;
    if ( Vec_IntEntry(vMapAdds, Gia_ObjId(p, pObj)) >= 0 )
    {
        int iBox = Vec_IntEntry(vMapAdds, Gia_ObjId(p, pObj));
        Gia_ObjSetTravIdCurrentId(p, Vec_IntEntry(vAdds, 6*iBox+3) );
        Gia_ObjSetTravIdCurrentId(p, Vec_IntEntry(vAdds, 6*iBox+4) );
        Level0 = Gia_ShowCollectObjs_rec( p, Gia_ManObj( p, Vec_IntEntry(vAdds, 6*iBox+0) ), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        Level1 = Gia_ShowCollectObjs_rec( p, Gia_ManObj( p, Vec_IntEntry(vAdds, 6*iBox+1) ), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        if ( Vec_IntEntry(vAdds, 6*iBox+2) )
        Level2 = Gia_ShowCollectObjs_rec( p, Gia_ManObj( p, Vec_IntEntry(vAdds, 6*iBox+2) ), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        Level = 1 + Abc_MaxInt( Abc_MaxInt(Level0, Level1), Level2 );
        Gia_ObjSetLevelId( p, Vec_IntEntry(vAdds, 6*iBox+3), Level );
        Gia_ObjSetLevelId( p, Vec_IntEntry(vAdds, 6*iBox+4), Level );
        pObj = Gia_ManObj( p, Vec_IntEntry(vAdds, 6*iBox+4) );
    }
    else if ( Vec_IntEntry(vMapXors, Gia_ObjId(p, pObj)) >= 0 )
    {
        int iXor = Vec_IntEntry(vMapXors, Gia_ObjId(p, pObj));
        Level0 = Gia_ShowCollectObjs_rec( p, Gia_ManObj( p, Vec_IntEntry(vXors, 4*iXor+1) ), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        Level1 = Gia_ShowCollectObjs_rec( p, Gia_ManObj( p, Vec_IntEntry(vXors, 4*iXor+2) ), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        if ( Vec_IntEntry(vXors, 4*iXor+3) )
        Level2 = Gia_ShowCollectObjs_rec( p, Gia_ManObj( p, Vec_IntEntry(vXors, 4*iXor+3) ), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        Level = 1 + Abc_MaxInt( Abc_MaxInt(Level0, Level1), Level2 );
        Gia_ObjSetLevel( p, pObj, Level );
    }
    else
    {
        assert( !Gia_ObjIsMux(p, pObj) );
        Level0 = Gia_ShowCollectObjs_rec( p, Gia_ObjFanin0(pObj), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        Level1 = Gia_ShowCollectObjs_rec( p, Gia_ObjFanin1(pObj), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        Level = 1 + Abc_MaxInt(Level0, Level1);
        Gia_ObjSetLevel( p, pObj, Level );
    }
    Vec_IntPush( vOrder, Gia_ObjId(p, pObj) );
    p->nLevels = Abc_MaxInt( p->nLevels, Level );
    return Level;
}